

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::cord_internal::anon_unknown_0::
AnalyzeBtree<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>
          (anon_unknown_0 *this,
          CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> rep,
          RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *raw_usage)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  anon_unknown_0 *paVar4;
  int iVar5;
  CordRepBtree *pCVar6;
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *extraout_RDX;
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *pRVar7;
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *extraout_RDX_00;
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *extraout_RDX_01;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> rep_00;
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> rep_01;
  
  dVar9 = rep.fraction;
  rep_00.rep = rep.rep;
  (rep_00.rep)->length = (size_t)(dVar9 * 64.0 + (double)(rep_00.rep)->length);
  pCVar6 = CordRep::btree((CordRep *)this);
  bVar1 = (pCVar6->super_CordRep).storage[1];
  bVar2 = (pCVar6->super_CordRep).storage[2];
  if ((pCVar6->super_CordRep).storage[0] == '\0') {
    pRVar7 = extraout_RDX;
    for (lVar8 = (ulong)bVar1 << 3; (ulong)bVar2 * 8 != lVar8; lVar8 = lVar8 + 8) {
      paVar4 = *(anon_unknown_0 **)((long)pCVar6->edges_ + lVar8);
      iVar3 = *(int *)(paVar4 + 8);
      iVar5 = iVar3 >> 1;
      auVar11._8_4_ = iVar3 >> 0x1f;
      auVar11._0_8_ = (long)iVar5;
      auVar11._12_4_ = 0x45300000;
      rep_01.fraction =
           dVar9 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,iVar5) - 4503599627370496.0));
      rep_01.rep = rep_00.rep;
      AnalyzeDataEdge<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>
                (paVar4,rep_01,pRVar7);
      pRVar7 = extraout_RDX_01;
    }
  }
  else {
    pRVar7 = extraout_RDX;
    for (lVar8 = (ulong)bVar1 << 3; (ulong)bVar2 * 8 != lVar8; lVar8 = lVar8 + 8) {
      paVar4 = *(anon_unknown_0 **)((long)pCVar6->edges_ + lVar8);
      iVar3 = *(int *)(paVar4 + 8);
      iVar5 = iVar3 >> 1;
      auVar10._8_4_ = iVar3 >> 0x1f;
      auVar10._0_8_ = (long)iVar5;
      auVar10._12_4_ = 0x45300000;
      rep_00.fraction =
           dVar9 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,iVar5) - 4503599627370496.0));
      AnalyzeBtree<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>
                (paVar4,rep_00,pRVar7);
      pRVar7 = extraout_RDX_00;
    }
  }
  return;
}

Assistant:

void AnalyzeBtree(CordRepRef<mode> rep, RawUsage<mode>& raw_usage) {
  raw_usage.Add(sizeof(CordRepBtree), rep);
  const CordRepBtree* tree = rep.rep->btree();
  if (tree->height() > 0) {
    for (CordRep* edge : tree->Edges()) {
      AnalyzeBtree(rep.Child(edge), raw_usage);
    }
  } else {
    for (CordRep* edge : tree->Edges()) {
      AnalyzeDataEdge(rep.Child(edge), raw_usage);
    }
  }
}